

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O1

mt32emu_return_code
mt32emu_add_rom_data
          (mt32emu_context context,mt32emu_bit8u *data,size_t data_size,
          mt32emu_sha1_digest *sha1_digest)

{
  mt32emu_return_code mVar1;
  ArrayFile *this;
  
  this = (ArrayFile *)operator_new(0x50);
  if (sha1_digest == (mt32emu_sha1_digest *)0x0) {
    MT32Emu::ArrayFile::ArrayFile(this,data,data_size);
  }
  else {
    MT32Emu::ArrayFile::ArrayFile(this,data,data_size,sha1_digest);
  }
  mVar1 = MT32Emu::addROMFiles(context,(File *)this,(File *)0x0,(MachineConfiguration *)0x0);
  return mVar1;
}

Assistant:

mt32emu_return_code MT32EMU_C_CALL mt32emu_add_rom_data(mt32emu_context context, const mt32emu_bit8u *data, size_t data_size, const mt32emu_sha1_digest *sha1_digest) {
	if (sha1_digest == NULL) return addROMFiles(context, new ArrayFile(data, data_size));
	return addROMFiles(context, new ArrayFile(data, data_size, *sha1_digest));
}